

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

int deflateReset(z_streamp strm)

{
  int iVar1;
  int ret;
  z_streamp strm_local;
  
  iVar1 = deflateResetKeep(strm);
  if (iVar1 == 0) {
    lm_init(strm->state);
  }
  return iVar1;
}

Assistant:

int ZEXPORT deflateReset (strm)
    z_streamp strm;
{
    int ret;

    ret = deflateResetKeep(strm);
    if (ret == Z_OK)
        lm_init(strm->state);
    return ret;
}